

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

int sf::Shader::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int extraout_EAX;
  ostream *poVar2;
  undefined4 in_register_0000003c;
  Shader *this;
  TransientContextLock lock;
  TransientContextLock local_9;
  
  this = (Shader *)CONCAT44(in_register_0000003c,__fd);
  GlResource::TransientContextLock::TransientContextLock(&local_9);
  bVar1 = isAvailable();
  if (bVar1) {
    if ((this == (Shader *)0x0) || (this->m_shaderProgram == 0)) {
      (*sf_glad_glUseProgramObjectARB)(0);
    }
    else {
      (*sf_glad_glUseProgramObjectARB)(this->m_shaderProgram);
      bindTextures(this);
      if (this->m_currentTexture != -1) {
        (*sf_glad_glUniform1iARB)(this->m_currentTexture,0);
      }
    }
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,
                             "Failed to bind or unbind shader: your system doesn\'t support shaders "
                            );
    poVar2 = std::operator<<(poVar2,
                             "(you should test Shader::isAvailable() before trying to use the Shader class)"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  GlResource::TransientContextLock::~TransientContextLock(&local_9);
  return extraout_EAX;
}

Assistant:

void Shader::bind(const Shader* shader)
{
    TransientContextLock lock;

    // Make sure that we can use shaders
    if (!isAvailable())
    {
        err() << "Failed to bind or unbind shader: your system doesn't support shaders "
              << "(you should test Shader::isAvailable() before trying to use the Shader class)" << std::endl;
        return;
    }

    if (shader && shader->m_shaderProgram)
    {
        // Enable the program
        glCheck(GLEXT_glUseProgramObject(castToGlHandle(shader->m_shaderProgram)));

        // Bind the textures
        shader->bindTextures();

        // Bind the current texture
        if (shader->m_currentTexture != -1)
            glCheck(GLEXT_glUniform1i(shader->m_currentTexture, 0));
    }
    else
    {
        // Bind no shader
        glCheck(GLEXT_glUseProgramObject(0));
    }
}